

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-connect-timeout.c
# Opt level: O3

int run_test_tcp_connect_timeout(void)

{
  int iVar1;
  int extraout_EAX;
  uv_connect_t *puVar2;
  undefined8 uVar3;
  int iVar4;
  char *pcVar5;
  uv_timer_t *puVar6;
  sockaddr_in addr;
  undefined1 local_20 [16];
  
  pcVar5 = "8.8.8.8";
  iVar4 = 9999;
  iVar1 = uv_ip4_addr("8.8.8.8",9999,local_20);
  if (iVar1 == 0) {
    puVar2 = (uv_connect_t *)uv_default_loop();
    iVar4 = 0x31e018;
    iVar1 = uv_timer_init();
    if (iVar1 != 0) goto LAB_00172413;
    puVar6 = &timer;
    iVar4 = 0x172431;
    iVar1 = uv_timer_start(&timer,timer_cb,0x32,0);
    puVar2 = (uv_connect_t *)puVar6;
    if (iVar1 != 0) goto LAB_00172418;
    puVar2 = (uv_connect_t *)uv_default_loop();
    iVar4 = 0x31e0b0;
    iVar1 = uv_tcp_init();
    if (iVar1 != 0) goto LAB_0017241d;
    puVar2 = &connect_req;
    iVar4 = 0x31e0b0;
    iVar1 = uv_tcp_connect(&connect_req,&conn,local_20,connect_cb);
    if (iVar1 != 0) {
      if (iVar1 == -0x65) {
        run_test_tcp_connect_timeout_cold_7();
        return 1;
      }
      goto LAB_00172422;
    }
    puVar2 = (uv_connect_t *)uv_default_loop();
    iVar4 = 0;
    iVar1 = uv_run();
    if (iVar1 == 0) {
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      iVar4 = 0;
      uv_run(uVar3);
      puVar2 = (uv_connect_t *)uv_default_loop();
      iVar1 = uv_loop_close();
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0017242c;
    }
  }
  else {
    run_test_tcp_connect_timeout_cold_1();
    puVar2 = (uv_connect_t *)pcVar5;
LAB_00172413:
    run_test_tcp_connect_timeout_cold_2();
LAB_00172418:
    run_test_tcp_connect_timeout_cold_3();
LAB_0017241d:
    run_test_tcp_connect_timeout_cold_4();
LAB_00172422:
    run_test_tcp_connect_timeout_cold_8();
  }
  run_test_tcp_connect_timeout_cold_5();
LAB_0017242c:
  run_test_tcp_connect_timeout_cold_6();
  if ((uv_timer_t *)puVar2 == &timer) {
    uv_close(&conn,close_cb);
    iVar1 = uv_close(&timer,close_cb);
    return iVar1;
  }
  timer_cb_cold_1();
  if (puVar2 == &connect_req) {
    if (iVar4 == -0x7d) {
      connect_cb_called = connect_cb_called + 1;
      return extraout_EAX;
    }
  }
  else {
    connect_cb_cold_1();
  }
  connect_cb_cold_2();
  if ((uv_timer_t *)puVar2 != &timer && (uv_tcp_t *)puVar2 != &conn) {
    close_cb_cold_1();
    iVar1 = uv_is_closing();
    if (iVar1 == 0) {
      iVar1 = uv_close(puVar2,0);
      return iVar1;
    }
    return iVar1;
  }
  close_cb_called = close_cb_called + 1;
  return (int)CONCAT71(0x31e0,(uv_tcp_t *)puVar2 == &conn);
}

Assistant:

TEST_IMPL(tcp_connect_timeout) {
  struct sockaddr_in addr;
  int r;

  ASSERT(0 == uv_ip4_addr("8.8.8.8", 9999, &addr));

  r = uv_timer_init(uv_default_loop(), &timer);
  ASSERT(r == 0);

  r = uv_timer_start(&timer, timer_cb, 50, 0);
  ASSERT(r == 0);

  r = uv_tcp_init(uv_default_loop(), &conn);
  ASSERT(r == 0);

  r = uv_tcp_connect(&connect_req,
                     &conn,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  if (r == UV_ENETUNREACH)
    RETURN_SKIP("Network unreachable.");
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}